

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

int NULLC::TypeSize(int *a)

{
  int iVar1;
  
  if (a == (int *)0x0) {
    iVar1 = 0;
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    if (*(uint *)(linker + 0x20c) <= (uint)*a) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    iVar1 = *(int *)(*(long *)(linker + 0x200) + 4 + (ulong)(uint)*a * 0x50);
  }
  return iVar1;
}

Assistant:

int NULLC::TypeSize(int* a)
{
	if(!a)
	{
		nullcThrowError("ERROR: null pointer access");
		return 0;
	}

	return linker->exTypes[*a].size;
}